

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O3

void string_suite::sanitize_10000000(void)

{
  encoder_type encoder;
  ostringstream result;
  basic_string_view<char,_std::char_traits<char>_> local_1d0;
  long local_1c0 [2];
  size_type local_1b0;
  undefined **local_1a8;
  ostringstream *local_1a0;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  local_1a8 = &PTR__base_00118c10;
  local_1d0._M_len = 1;
  local_1d0._M_str = anon_var_dwarf_f510 + 2;
  local_1a0 = local_180;
  local_1b0 = trial::protocol::json::detail::basic_encoder<char,24ul>::
              string_value<std::basic_string_view<char,std::char_traits<char>>>
                        ((basic_encoder<char,24ul> *)&local_1a8,&local_1d0);
  local_1d0._M_len = CONCAT44(local_1d0._M_len._4_4_,3);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(\"\\x80\")","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x29d,"void string_suite::sanitize_10000000()",&local_1b0,&local_1d0);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("result.str()","\"\\\"?\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x29e,"void string_suite::sanitize_10000000()",&local_1d0,"\"?\"");
  if ((long *)local_1d0._M_len != local_1c0) {
    operator_delete((void *)local_1d0._M_len,local_1c0[0] + 1);
  }
  (*(code *)*local_1a8)();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void sanitize_10000000()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value("\x80"), 3);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "\"?\"");
}